

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O1

CURLcode sasl_create_cram_md5_message
                   (SessionHandle *data,char *chlg,char *userp,char *passwdp,char **outptr,
                   size_t *outlen)

{
  uint uVar1;
  CURLcode CVar2;
  size_t uznum;
  size_t uznum_00;
  HMAC_context *ctxt;
  char *inputbuff;
  uchar digest [16];
  
  if (chlg == (char *)0x0) {
    uznum = 0;
  }
  else {
    uznum = strlen(chlg);
  }
  uznum_00 = strlen(passwdp);
  uVar1 = curlx_uztoui(uznum_00);
  ctxt = Curl_HMAC_init(Curl_HMAC_MD5,(uchar *)passwdp,uVar1);
  CVar2 = CURLE_OUT_OF_MEMORY;
  if (ctxt != (HMAC_context *)0x0) {
    if (uznum != 0) {
      uVar1 = curlx_uztoui(uznum);
      Curl_HMAC_update(ctxt,(uchar *)chlg,uVar1);
    }
    Curl_HMAC_final(ctxt,digest);
    inputbuff = curl_maprintf("%s %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x",
                              userp,(ulong)digest[0],(ulong)digest[1],(ulong)digest[2],
                              (ulong)digest[3],(ulong)digest[4],(ulong)digest[5],(ulong)digest[6],
                              (ulong)digest[7],(ulong)digest[8],(ulong)digest[9],(ulong)digest[10],
                              (ulong)digest[0xb],(ulong)digest[0xc],(ulong)digest[0xd],
                              (ulong)digest[0xe],(ulong)digest[0xf]);
    CVar2 = CURLE_OUT_OF_MEMORY;
    if (inputbuff != (char *)0x0) {
      CVar2 = Curl_base64_encode(data,inputbuff,0,outptr,outlen);
      (*Curl_cfree)(inputbuff);
    }
  }
  return CVar2;
}

Assistant:

static CURLcode sasl_create_cram_md5_message(struct SessionHandle *data,
                                             const char *chlg,
                                             const char *userp,
                                             const char *passwdp,
                                             char **outptr, size_t *outlen)
{
  CURLcode result = CURLE_OK;
  size_t chlglen = 0;
  HMAC_context *ctxt;
  unsigned char digest[MD5_DIGEST_LEN];
  char *response;

  if(chlg)
    chlglen = strlen(chlg);

  /* Compute the digest using the password as the key */
  ctxt = Curl_HMAC_init(Curl_HMAC_MD5,
                        (const unsigned char *) passwdp,
                        curlx_uztoui(strlen(passwdp)));
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  /* Update the digest with the given challenge */
  if(chlglen > 0)
    Curl_HMAC_update(ctxt, (const unsigned char *) chlg,
                     curlx_uztoui(chlglen));

  /* Finalise the digest */
  Curl_HMAC_final(ctxt, digest);

  /* Generate the response */
  response = aprintf(
      "%s %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x",
           userp, digest[0], digest[1], digest[2], digest[3], digest[4],
           digest[5], digest[6], digest[7], digest[8], digest[9], digest[10],
           digest[11], digest[12], digest[13], digest[14], digest[15]);
  if(!response)
    return CURLE_OUT_OF_MEMORY;

  /* Base64 encode the response */
  result = Curl_base64_encode(data, response, 0, outptr, outlen);

  free(response);

  return result;
}